

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recorder.cpp
# Opt level: O1

void __thiscall
minibag::Recorder::doQueue
          (Recorder *this,MessageEvent<const_miniros::topic_tools::ShapeShifter> *msg_event,
          string *topic,shared_ptr<miniros::Subscriber> *subscriber,shared_ptr<int> *count)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Elt_pointer pOVar2;
  pointer pcVar3;
  int *piVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  Time _time;
  ostream *poVar8;
  ulong uVar9;
  undefined8 uVar10;
  ulong uVar11;
  Time now;
  OutgoingMessage drop;
  OutgoingMessage out;
  pthread_mutex_t *local_120;
  TimeBase<miniros::Time,_miniros::Duration> local_118;
  TimeBase<miniros::Time,_miniros::Duration> local_110 [2];
  long local_100 [2];
  shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_f0;
  ConstPtr local_e0;
  shared_ptr<int> *local_d0;
  DurationBase<miniros::Duration> local_c8;
  OutgoingMessage local_c0;
  OutgoingMessage local_78;
  
  local_d0 = count;
  _time.super_TimeBase<miniros::Time,_miniros::Duration> =
       (TimeBase<miniros::Time,_miniros::Duration>)miniros::Time::now();
  if ((this->options_).verbose == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Received message on topic ",0x1a);
    miniros::Subscriber::getTopic_abi_cxx11_();
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_78.topic._M_dataplus._M_p,
                        local_78.topic._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.topic._M_dataplus._M_p != &local_78.topic.field_2) {
      operator_delete(local_78.topic._M_dataplus._M_p,
                      local_78.topic.field_2._M_allocated_capacity + 1);
    }
  }
  local_e0.super___shared_ptr<const_miniros::topic_tools::ShapeShifter,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (msg_event->message_).
           super___shared_ptr<const_miniros::topic_tools::ShapeShifter,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_e0.super___shared_ptr<const_miniros::topic_tools::ShapeShifter,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (msg_event->message_).
       super___shared_ptr<const_miniros::topic_tools::ShapeShifter,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_e0.
      super___shared_ptr<const_miniros::topic_tools::ShapeShifter,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_e0.
       super___shared_ptr<const_miniros::topic_tools::ShapeShifter,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_e0.
            super___shared_ptr<const_miniros::topic_tools::ShapeShifter,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_e0.
       super___shared_ptr<const_miniros::topic_tools::ShapeShifter,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_e0.
            super___shared_ptr<const_miniros::topic_tools::ShapeShifter,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_f0.
  super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (msg_event->connection_header_).
            super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  local_f0.
  super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (msg_event->connection_header_).
       super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  if (local_f0.
      super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_f0.
       super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_f0.
            super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_f0.
       super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_f0.
            super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  OutgoingMessage::OutgoingMessage(&local_78,topic,&local_e0,&local_f0,_time);
  if (local_f0.
      super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f0.
               super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_e0.
      super___shared_ptr<const_miniros::topic_tools::ShapeShifter,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e0.
               super___shared_ptr<const_miniros::topic_tools::ShapeShifter,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)&this->queue_mutex_);
  if (iVar6 == 0) {
    std::deque<minibag::OutgoingMessage,_std::allocator<minibag::OutgoingMessage>_>::push_back
              (&this->queue_->c,&local_78);
    uVar7 = miniros::topic_tools::ShapeShifter::size();
    uVar9 = (ulong)uVar7 + this->queue_size_;
    this->queue_size_ = uVar9;
    uVar11 = (ulong)(this->options_).buffer_size;
    if ((uVar11 != 0) && (uVar11 < uVar9)) {
      paVar1 = &local_c0.topic.field_2;
      do {
        pOVar2 = (this->queue_->c).
                 super__Deque_base<minibag::OutgoingMessage,_std::allocator<minibag::OutgoingMessage>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
        pcVar3 = (pOVar2->topic)._M_dataplus._M_p;
        local_c0.topic._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c0,pcVar3,pcVar3 + (pOVar2->topic)._M_string_length);
        local_c0.msg.
        super___shared_ptr<const_miniros::topic_tools::ShapeShifter,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (pOVar2->msg).
                 super___shared_ptr<const_miniros::topic_tools::ShapeShifter,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        local_c0.msg.
        super___shared_ptr<const_miniros::topic_tools::ShapeShifter,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (pOVar2->msg).
             super___shared_ptr<const_miniros::topic_tools::ShapeShifter,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
        if (local_c0.msg.
            super___shared_ptr<const_miniros::topic_tools::ShapeShifter,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_c0.msg.
             super___shared_ptr<const_miniros::topic_tools::ShapeShifter,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (local_c0.msg.
                  super___shared_ptr<const_miniros::topic_tools::ShapeShifter,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_c0.msg.
             super___shared_ptr<const_miniros::topic_tools::ShapeShifter,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (local_c0.msg.
                  super___shared_ptr<const_miniros::topic_tools::ShapeShifter,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_c0.connection_header.
        super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (pOVar2->connection_header).
                  super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        local_c0.connection_header.
        super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi =
             (pOVar2->connection_header).
             super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
        if (local_c0.connection_header.
            super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_c0.connection_header.
             super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (local_c0.connection_header.
                  super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_c0.connection_header.
             super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (local_c0.connection_header.
                  super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_c0.time.super_TimeBase<miniros::Time,_miniros::Duration> =
             (pOVar2->time).super_TimeBase<miniros::Time,_miniros::Duration>;
        std::deque<minibag::OutgoingMessage,_std::allocator<minibag::OutgoingMessage>_>::pop_front
                  (&this->queue_->c);
        uVar7 = miniros::topic_tools::ShapeShifter::size();
        this->queue_size_ = this->queue_size_ - (ulong)uVar7;
        if ((this->options_).snapshot == false) {
          local_118 = (TimeBase<miniros::Time,_miniros::Duration>)miniros::Time::now();
          local_c8.sec = 0;
          local_c8.nsec = 0;
          miniros::DurationBase<miniros::Duration>::fromSec(5.0);
          local_110[0] = (TimeBase<miniros::Time,_miniros::Duration>)
                         miniros::TimeBase<miniros::Time,_miniros::Duration>::operator+
                                   (&(this->last_buffer_warn_).
                                     super_TimeBase<miniros::Time,_miniros::Duration>,
                                    (Duration *)&local_c8);
          cVar5 = miniros::TimeBase<miniros::Time,miniros::Duration>::operator>
                            ((TimeBase<miniros::Time,miniros::Duration> *)&local_118,
                             (Time *)local_110);
          if (cVar5 != '\0') {
            if ((char)miniros::console::g_initialized == '\0') {
              miniros::console::initialize();
            }
            if (doQueue::loc.initialized_ == false) {
              local_110[0] = (TimeBase<miniros::Time,_miniros::Duration>)local_100;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_110,"miniros.unknown_package","");
              miniros::console::initializeLogLocation(&doQueue::loc,(string *)local_110,Warn);
              if (local_110[0] != (TimeBase<miniros::Time,_miniros::Duration>)local_100) {
                operator_delete((void *)local_110[0],local_100[0] + 1);
              }
            }
            if (doQueue::loc.level_ != Warn) {
              miniros::console::setLogLocationLevel(&doQueue::loc,Warn);
              miniros::console::checkLogLocationEnabled(&doQueue::loc);
            }
            if (doQueue::loc.logger_enabled_ == true) {
              miniros::console::print
                        ((FilterBase *)0x0,doQueue::loc.logger_,doQueue::loc.level_,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/rosbag/recorder.cpp"
                         ,0x111,
                         "void minibag::Recorder::doQueue(const miniros::MessageEvent<const miniros::topic_tools::ShapeShifter> &, const string &, shared_ptr<miniros::Subscriber>, shared_ptr<int>)"
                         ,"rosbag record buffer exceeded.  Dropping oldest queued message.");
            }
            (this->last_buffer_warn_).super_TimeBase<miniros::Time,_miniros::Duration> = local_118;
          }
        }
        if (local_c0.connection_header.
            super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_c0.connection_header.
                     super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if (local_c0.msg.
            super___shared_ptr<const_miniros::topic_tools::ShapeShifter,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_c0.msg.
                     super___shared_ptr<const_miniros::topic_tools::ShapeShifter,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0.topic._M_dataplus._M_p != paVar1) {
          operator_delete(local_c0.topic._M_dataplus._M_p,
                          local_c0.topic.field_2._M_allocated_capacity + 1);
        }
        uVar9 = (ulong)(this->options_).buffer_size;
      } while ((uVar9 != 0) && (uVar9 < this->queue_size_));
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->queue_mutex_);
    if ((this->options_).snapshot == false) {
      std::_V2::condition_variable_any::notify_all(&this->queue_condition_);
    }
    piVar4 = (local_d0->super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    iVar6 = *piVar4;
    if ((0 < iVar6) && (iVar6 = iVar6 + -1, *piVar4 = iVar6, iVar6 == 0)) {
      miniros::Subscriber::shutdown();
      piVar4 = &this->num_subscribers_;
      *piVar4 = *piVar4 + -1;
      if (*piVar4 == 0) {
        miniros::shutdown();
      }
    }
    if (local_78.connection_header.
        super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.connection_header.
                 super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_78.msg.
        super___shared_ptr<const_miniros::topic_tools::ShapeShifter,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.msg.
                 super___shared_ptr<const_miniros::topic_tools::ShapeShifter,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.topic._M_dataplus._M_p != &local_78.topic.field_2) {
      operator_delete(local_78.topic._M_dataplus._M_p,
                      local_78.topic.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  uVar10 = std::__throw_system_error(iVar6);
  OutgoingMessage::~OutgoingMessage(&local_c0);
  pthread_mutex_unlock(local_120);
  OutgoingMessage::~OutgoingMessage(&local_78);
  _Unwind_Resume(uVar10);
}

Assistant:

void Recorder::doQueue(const miniros::MessageEvent<miniros::topic_tools::ShapeShifter const>& msg_event,
  string const& topic, shared_ptr<miniros::Subscriber> subscriber, shared_ptr<int> count)
{
  miniros::Time rectime = miniros::Time::now();

  if (options_.verbose)
    cout << "Received message on topic " << subscriber->getTopic() << endl;

  OutgoingMessage out(topic, msg_event.getMessage(), msg_event.getConnectionHeaderPtr(), rectime);

  {
    std::scoped_lock<std::mutex> lock(queue_mutex_);

    queue_->push(out);
    queue_size_ += out.msg->size();

    // Check to see if buffer has been exceeded
    while (options_.buffer_size > 0 && queue_size_ > options_.buffer_size) {
      OutgoingMessage drop = queue_->front();
      queue_->pop();
      queue_size_ -= drop.msg->size();

      if (!options_.snapshot) {
        miniros::Time now = miniros::Time::now();
        if (now > last_buffer_warn_ + miniros::Duration(5.0)) {
          MINIROS_WARN("rosbag record buffer exceeded.  Dropping oldest queued message.");
          last_buffer_warn_ = now;
        }
      }
    }
  }

  if (!options_.snapshot)
    queue_condition_.notify_all();

  // If we are book-keeping count, decrement and possibly shutdown
  if ((*count) > 0) {
    (*count)--;
    if ((*count) == 0) {
      subscriber->shutdown();

      num_subscribers_--;

      if (num_subscribers_ == 0)
        miniros::shutdown();
    }
  }
}